

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

uint32_t Catch::generateRandomSeed(GenerateFrom from)

{
  uint32_t uVar1;
  time_t tVar2;
  random_device rd;
  ReusableStringStream local_13a0;
  random_device local_1390;
  
  if (from - RandomDevice < 2) {
    std::random_device::random_device(&local_1390);
    uVar1 = std::random_device::_M_getval();
    std::random_device::~random_device(&local_1390);
  }
  else {
    if (from != Time) {
      ReusableStringStream::ReusableStringStream(&local_13a0);
      std::operator<<(local_13a0.m_oss,"Unknown generation method");
      std::__cxx11::stringbuf::str();
      throw_domain_error((string *)&local_1390);
    }
    tVar2 = time((time_t *)0x0);
    uVar1 = (uint32_t)tVar2;
  }
  return uVar1;
}

Assistant:

std::uint32_t generateRandomSeed( GenerateFrom from ) {
        switch ( from ) {
        case GenerateFrom::Time:
            return static_cast<std::uint32_t>( std::time( nullptr ) );

        case GenerateFrom::Default:
        case GenerateFrom::RandomDevice: {
            std::random_device rd;
            return Detail::fillBitsFrom<std::uint32_t>( rd );
        }

        default:
            CATCH_ERROR("Unknown generation method");
        }
    }